

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>
::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,true,false,true>>>
           *this,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *orderedBoundaries,Column_settings *colSettings)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference boundary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  reference local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *b;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range3;
  Column_settings *colSettings_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *orderedBoundaries_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  iVar2 = Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>
          ::get_null_value<int>();
  Matrix_all_dimension_holder<int>::Matrix_all_dimension_holder
            ((Matrix_all_dimension_holder<int> *)this,iVar2);
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
  ::Chain_vine_swap((Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>
                     *)(this + 0x20));
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(orderedBoundaries);
  Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>,_false,_unsigned_int>
  ::Matrix_row_access((Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>,_false,_unsigned_int>
                       *)(this + 0xf0),(uint)sVar3);
  std::
  unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
                   *)(this + 0xf8));
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)(this + 0x130));
  *(undefined4 *)(this + 0x168) = 0;
  *(Column_settings **)(this + 0x170) = colSettings;
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(orderedBoundaries);
  std::
  unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
  ::reserve((unordered_map<unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>_>_>_>_>
             *)(this + 0xf8),sVar3);
  sVar3 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(orderedBoundaries);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::reserve((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)(this + 0x130),sVar3);
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(orderedBoundaries);
  b = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end(orderedBoundaries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&b);
    if (!bVar1) break;
    boundary = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator*(&__end0);
    local_50 = boundary;
    iVar2 = Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_false,_true>_>
            ::get_null_value<int>();
    insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (&local_68,this,boundary,iVar2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(const std::vector<Boundary_range>& orderedBoundaries,
                                                 Column_settings* colSettings)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      RA_opt(orderedBoundaries.size()),
      nextIndex_(0),
      colSettings_(colSettings)
{
  matrix_.reserve(orderedBoundaries.size());
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(orderedBoundaries.size());
  } else {
    pivotToColumnIndex_.resize(orderedBoundaries.size(), Master_matrix::template get_null_value<Index>());
  }

  for (const Boundary_range& b : orderedBoundaries) {
    insert_boundary(b);
  }
}